

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O2

void ut::are_equal<unsigned_short,20ul,std::vector<unsigned_short,std::allocator<unsigned_short>>>
               (unsigned_short (*expected) [20],
               vector<unsigned_short,_std::allocator<unsigned_short>_> *actual,
               LocationInfo *location)

{
  bool value;
  unsigned_short *__first2;
  unsigned_short *local_28;
  unsigned_long local_20;
  
  local_20 = 0x14;
  __first2 = (unsigned_short *)
             ((long)(actual->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(actual->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 1);
  local_28 = __first2;
  are_equal<unsigned_long,unsigned_long>(&local_20,(unsigned_long *)&local_28,location);
  value = std::__equal<true>::equal<unsigned_short>
                    ((__equal<true> *)expected,expected[1],
                     (actual->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                     _M_impl.super__Vector_impl_data._M_start,__first2);
  is_true(value,location);
  return;
}

Assistant:

inline void are_equal(T (&expected)[n], const ContainerT &actual, const LocationInfo &location)
	{
		are_equal(n, static_cast<size_t>(std::distance(actual.begin(), actual.end())), location);
		is_true(std::equal(expected, expected + n, actual.begin()), location);
	}